

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void stbtt_Rasterize(stbtt__bitmap *result,float flatness_in_pixels,stbtt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,void *userdata)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float *__s;
  bool bVar3;
  uint uVar4;
  void *p;
  stbtt__point *points;
  stbtt__edge *p_00;
  float *scanline;
  stbtt__active_edge *psVar5;
  stbtt__active_edge *psVar6;
  undefined8 *puVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uchar uVar12;
  int iVar13;
  stbtt__active_edge *psVar14;
  stbtt__edge *psVar15;
  int iVar16;
  uint uVar17;
  stbtt__edge *psVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  stbtt__bitmap *psVar24;
  undefined8 *puVar25;
  stbtt__active_edge *z;
  bool bVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar33;
  float fVar34;
  undefined1 auVar32 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 in_register_000012c4 [12];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float y_bottom;
  float y0;
  stbtt__active_edge *active;
  float scanline_data [129];
  float local_300;
  float local_2f8;
  int local_2e4;
  stbtt__active_edge *local_2d8;
  int local_2d0;
  undefined1 local_2a0 [24];
  undefined8 *local_288;
  stbtt__bitmap *local_280;
  float *local_278;
  int local_270;
  float local_26c;
  undefined1 local_268 [16];
  ulong local_258;
  float *local_250;
  float local_248;
  ulong local_238;
  int local_230;
  
  local_268._4_12_ = in_register_000012c4;
  local_268._0_4_ = shift_x;
  if (0 < num_verts) {
    fVar27 = scale_y;
    if (scale_x <= scale_y) {
      fVar27 = scale_x;
    }
    fVar27 = (flatness_in_pixels / fVar27) * (flatness_in_pixels / fVar27);
    lVar10 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + ((&vertices->type)[lVar10] == '\x01');
      lVar10 = lVar10 + 0xe;
    } while ((ulong)(uint)num_verts * 0xe != lVar10);
    if (uVar4 != 0) {
      local_2a0._16_8_ = local_2a0._8_8_;
      local_2a0._8_8_ = CONCAT44(0,uVar4);
      local_248 = shift_y;
      lVar10 = (**(code **)((long)userdata + 8))(*userdata,0,CONCAT44(0,uVar4) * 4);
      if (lVar10 != 0) {
        scanline = (float *)&local_238;
        bVar3 = false;
        local_300 = 0.0;
        points = (stbtt__point *)0x0;
        fVar29 = 0.0;
        local_280 = result;
        local_258 = (ulong)(uint)y_off;
        bVar26 = true;
        do {
          bVar8 = bVar26;
          if ((bVar3) &&
             (points = (stbtt__point *)
                       (**(code **)((long)userdata + 8))(*userdata,0,(long)(int)fVar29 << 3),
             points == (stbtt__point *)0x0)) {
            (**(code **)((long)userdata + 0x10))(*userdata,0);
            (**(code **)((long)userdata + 0x10))(*userdata,lVar10);
            return;
          }
          local_238 = local_238 & 0xffffffff00000000;
          fVar29 = 0.0;
          fVar30 = 0.0;
          uVar4 = 0xffffffff;
          lVar23 = 0;
          do {
            fVar36 = (float)local_238;
            switch((&vertices->type)[lVar23]) {
            case '\x01':
              if (-1 < (int)uVar4) {
                *(int *)(lVar10 + (ulong)uVar4 * 4) = (int)(float)local_238 - (int)local_300;
              }
              uVar4 = uVar4 + 1;
              auVar32 = ZEXT416(*(uint *)((long)&vertices->x + lVar23));
              auVar32 = pshuflw(auVar32,auVar32,0x60);
              fVar29 = (float)(auVar32._0_4_ >> 0x10);
              fVar30 = (float)(auVar32._4_4_ >> 0x10);
              local_238 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
              if (points != (stbtt__point *)0x0) {
                points[(int)fVar36].x = fVar29;
                points[(int)fVar36].y = fVar30;
              }
              local_300 = fVar36;
              break;
            case '\x02':
              lVar11 = (long)(int)(float)local_238;
              auVar32 = ZEXT416(*(uint *)((long)&vertices->x + lVar23));
              auVar32 = pshuflw(auVar32,auVar32,0x60);
              fVar29 = (float)(auVar32._0_4_ >> 0x10);
              fVar30 = (float)(auVar32._4_4_ >> 0x10);
              local_238 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
              if (points != (stbtt__point *)0x0) {
                points[lVar11].x = fVar29;
                points[lVar11].y = fVar30;
              }
              break;
            case '\x03':
              stbtt__tesselate_curve
                        (points,(int *)scanline,fVar29,fVar30,
                         (float)(int)*(short *)((long)&vertices->cx + lVar23),
                         (float)(int)*(short *)((long)&vertices->cy + lVar23),
                         (float)(int)*(short *)((long)&vertices->x + lVar23),
                         (float)(int)*(short *)((long)&vertices->y + lVar23),fVar27,0);
              goto LAB_0010fed9;
            case '\x04':
              stbtt__tesselate_cubic
                        (points,(int *)scanline,fVar29,fVar30,
                         (float)(int)*(short *)((long)&vertices->cx + lVar23),
                         (float)(int)*(short *)((long)&vertices->cy + lVar23),
                         (float)(int)*(short *)((long)&vertices->cx1 + lVar23),
                         (float)(int)*(short *)((long)&vertices->cy1 + lVar23),
                         (float)(int)*(short *)((long)&vertices->x + lVar23),
                         (float)(int)*(short *)((long)&vertices->y + lVar23),fVar27,0);
LAB_0010fed9:
              auVar32 = ZEXT416(*(uint *)((long)&vertices->x + lVar23));
              auVar32 = pshuflw(auVar32,auVar32,0x60);
              fVar29 = (float)(auVar32._0_4_ >> 0x10);
              fVar30 = (float)(auVar32._4_4_ >> 0x10);
            }
            lVar23 = lVar23 + 0xe;
          } while ((ulong)(uint)num_verts * 0xe != lVar23);
          *(int *)(lVar10 + (long)(int)uVar4 * 4) = (int)(float)local_238 - (int)local_300;
          bVar3 = true;
          fVar29 = (float)local_238;
          bVar26 = false;
        } while (bVar8);
        if (points != (stbtt__point *)0x0) {
          lVar11 = 0;
          lVar23 = 0;
          do {
            lVar23 = (long)(int)lVar23 + (long)*(int *)(lVar10 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          } while (local_2a0._8_8_ != lVar11);
          local_2f8 = scale_y;
          if (invert != 0) {
            local_2f8 = -scale_y;
          }
          uVar4 = 0;
          p_00 = (stbtt__edge *)(**(code **)((long)userdata + 8))(*userdata,0,lVar23 * 0x14 + 0x14);
          if (p_00 != (stbtt__edge *)0x0) {
            lVar23 = 0;
            iVar13 = 0;
            do {
              iVar9 = *(int *)(lVar10 + lVar23 * 4);
              if (0 < iVar9) {
                uVar21 = (ulong)(iVar9 - 1);
                uVar19 = 0;
                iVar16 = iVar9;
                do {
                  iVar20 = (int)uVar21;
                  uVar21 = (ulong)iVar20;
                  fVar27 = points[(long)iVar13 + uVar21].y;
                  fVar29 = points[(long)iVar13 + uVar19].y;
                  if ((fVar27 != fVar29) || (NAN(fVar27) || NAN(fVar29))) {
                    psVar15 = p_00 + (int)uVar4;
                    p_00[(int)uVar4].invert = 0;
                    if (invert == 0) {
                      if (fVar27 < fVar29) goto LAB_0011005f;
LAB_00110071:
                      iVar20 = (int)uVar19;
                    }
                    else {
                      if (fVar27 <= fVar29) goto LAB_00110071;
LAB_0011005f:
                      psVar15->invert = 1;
                      uVar21 = uVar19;
                    }
                    fVar28 = points[(long)iVar13 + (long)iVar20].x * scale_x +
                             (float)local_268._0_4_;
                    fVar33 = points[(long)iVar13 + (long)iVar20].y * local_2f8 + local_248;
                    fVar34 = points[(long)iVar13 + uVar21].x * scale_x + (float)local_268._0_4_;
                    fVar35 = points[(long)iVar13 + uVar21].y * local_2f8 + local_248;
                    psVar15->x0 = fVar28;
                    psVar15->y0 = fVar33;
                    psVar15->x1 = fVar34;
                    psVar15->y1 = fVar35;
                    uVar4 = uVar4 + 1;
                    iVar16 = *(int *)(lVar10 + lVar23 * 4);
                  }
                  uVar21 = uVar19 & 0xffffffff;
                  uVar19 = uVar19 + 1;
                } while ((long)uVar19 < (long)iVar16);
              }
              iVar13 = iVar13 + iVar9;
              lVar23 = lVar23 + 1;
            } while (lVar23 != local_2a0._8_8_);
            stbtt__sort_edges_quicksort(p_00,uVar4);
            psVar24 = local_280;
            if (1 < (int)uVar4) {
              uVar19 = 1;
              lVar23 = 2;
              psVar15 = p_00;
              do {
                uVar1 = p_00[uVar19].x0;
                uVar2 = p_00[uVar19].y0;
                local_230 = p_00[uVar19].invert;
                local_238._0_4_ = p_00[uVar19].x1;
                local_238._4_4_ = p_00[uVar19].y1;
                lVar11 = lVar23;
                psVar18 = psVar15;
                do {
                  if (psVar18->y0 <= (float)uVar2) {
                    uVar17 = (int)lVar11 - 1;
                    goto LAB_0011014d;
                  }
                  psVar18[1].invert = psVar18->invert;
                  fVar27 = psVar18->y0;
                  fVar29 = psVar18->x1;
                  fVar30 = psVar18->y1;
                  psVar18[1].x0 = psVar18->x0;
                  psVar18[1].y0 = fVar27;
                  psVar18[1].x1 = fVar29;
                  psVar18[1].y1 = fVar30;
                  lVar11 = lVar11 + -1;
                  psVar18 = psVar18 + -1;
                } while (1 < lVar11);
                uVar17 = 0;
LAB_0011014d:
                if (uVar19 != uVar17) {
                  p_00[(int)uVar17].x0 = (float)uVar1;
                  p_00[(int)uVar17].y0 = (float)uVar2;
                  p_00[(int)uVar17].x1 = (float)local_238;
                  p_00[(int)uVar17].y1 = (float)local_238._4_4_;
                  p_00[(int)uVar17].invert = local_230;
                }
                uVar19 = uVar19 + 1;
                lVar23 = lVar23 + 1;
                psVar15 = psVar15 + 1;
              } while (uVar19 != uVar4);
            }
            local_2a0._0_8_ = (stbtt__active_edge *)0x0;
            uVar19 = (ulong)(uint)local_280->w;
            if (0x40 < local_280->w) {
              scanline = (float *)(**(code **)((long)userdata + 8))(*userdata,0,uVar19 * 8 + 4);
              uVar19 = (ulong)(uint)psVar24->w;
            }
            iVar13 = psVar24->h;
            p_00[(int)uVar4].y0 = (float)(iVar13 + (int)local_258) + 1.0;
            if (0 < iVar13) {
              local_26c = (float)x_off;
              local_278 = scanline + (int)uVar19;
              local_250 = local_278 + 1;
              uVar21 = local_258 & 0xffffffff;
              local_2e4 = 0;
              local_288 = (undefined8 *)0x0;
              local_2d0 = 0;
              local_2d8 = (stbtt__active_edge *)0x0;
              psVar15 = p_00;
              psVar14 = (stbtt__active_edge *)0x0;
              do {
                __s = local_278;
                local_270 = (int)uVar21;
                fVar27 = (float)local_270;
                fVar29 = fVar27 + 1.0;
                memset(scanline,0,(long)(int)uVar19 << 2);
                memset(__s,0,(long)psVar24->w * 4 + 4);
                puVar25 = local_288;
                if (psVar14 != (stbtt__active_edge *)0x0) {
                  psVar5 = (stbtt__active_edge *)local_2a0;
                  do {
                    psVar6 = psVar14;
                    if (psVar14->ey <= fVar27) {
                      psVar5->next = psVar14->next;
                      psVar14->direction = 0.0;
                      psVar14->next = local_2d8;
                      psVar6 = psVar5;
                      local_2d8 = psVar14;
                    }
                    psVar14 = psVar6->next;
                    psVar5 = psVar6;
                  } while (psVar14 != (stbtt__active_edge *)0x0);
                }
                fVar30 = psVar15->y0;
                if (fVar30 <= fVar29) {
                  bVar26 = (int)local_258 != 0;
                  do {
                    fVar36 = psVar15->y1;
                    if ((fVar30 != fVar36) || (NAN(fVar30) || NAN(fVar36))) {
                      puVar7 = puVar25;
                      if (local_2d8 == (stbtt__active_edge *)0x0) {
                        if (local_2d0 == 0) {
                          puVar7 = (undefined8 *)
                                   (**(code **)((long)userdata + 8))(*userdata,0,0x6408);
                          if (puVar7 == (undefined8 *)0x0) {
                            local_2d0 = 0;
                            local_2d8 = (stbtt__active_edge *)0x0;
                            goto LAB_00110a09;
                          }
                          *puVar7 = puVar25;
                          fVar30 = psVar15->y0;
                          fVar36 = psVar15->y1;
                          local_2d0 = 799;
                        }
                        else {
                          local_2d0 = local_2d0 + -1;
                        }
                        local_2d8 = (stbtt__active_edge *)(puVar7 + (long)local_2d0 * 4 + 1);
                        psVar14 = (stbtt__active_edge *)0x0;
                      }
                      else {
                        psVar14 = local_2d8->next;
                      }
                      fVar31 = psVar15->x0;
                      fVar43 = (psVar15->x1 - fVar31) / (fVar36 - fVar30);
                      local_2d8->fdx = fVar43;
                      local_2d8->fdy = (float)(-(uint)(fVar43 != 0.0) & (uint)(1.0 / fVar43));
                      local_2d8->fx = ((fVar27 - fVar30) * fVar43 + fVar31) - local_26c;
                      local_2d8->direction =
                           *(float *)(&DAT_0015b688 + (ulong)(psVar15->invert == 0) * 4);
                      local_2d8->sy = fVar30;
                      local_2d8->ey = fVar36;
                      local_2d8->next = (stbtt__active_edge *)0x0;
                      if (fVar36 < fVar27 && (local_2e4 == 0 && bVar26)) {
                        local_2d8->ey = fVar27;
                      }
                      local_2d8->next = (stbtt__active_edge *)local_2a0._0_8_;
                      local_2a0._0_8_ = local_2d8;
                      local_2d8 = psVar14;
                      puVar25 = puVar7;
                    }
LAB_00110a09:
                    fVar30 = psVar15[1].y0;
                    psVar15 = psVar15 + 1;
                  } while (fVar30 <= fVar29);
                }
                uVar4 = local_280->w;
                local_288 = puVar25;
                if ((stbtt__active_edge *)local_2a0._0_8_ != (stbtt__active_edge *)0x0) {
                  fVar30 = (float)(int)uVar4;
                  psVar14 = (stbtt__active_edge *)local_2a0._0_8_;
                  do {
                    fVar31 = psVar14->fx;
                    fVar36 = psVar14->fdx;
                    if ((fVar36 != 0.0) || (NAN(fVar36))) {
                      fVar42 = fVar36 + fVar31;
                      fVar43 = psVar14->sy;
                      fVar37 = (float)(~-(uint)(fVar27 < fVar43) & (uint)fVar31 |
                                      (uint)((fVar43 - fVar27) * fVar36 + fVar31) &
                                      -(uint)(fVar27 < fVar43));
                      if (0.0 <= fVar37) {
                        fVar38 = psVar14->ey;
                        fVar41 = (float)(-(uint)(fVar38 < fVar29) &
                                         (uint)((fVar38 - fVar27) * fVar36 + fVar31) |
                                        ~-(uint)(fVar38 < fVar29) & (uint)fVar42);
                        if (((0.0 <= fVar41) && (fVar37 < fVar30)) && (fVar41 < fVar30)) {
                          if (fVar43 <= fVar27) {
                            fVar43 = fVar27;
                          }
                          iVar13 = (int)fVar37;
                          if (fVar29 <= fVar38) {
                            fVar38 = fVar29;
                          }
                          iVar9 = (int)fVar41;
                          if (iVar13 == iVar9) {
                            lVar23 = (long)iVar13;
                            scanline[lVar23] =
                                 (((fVar41 - (float)iVar13) + (fVar37 - (float)iVar13)) * -0.5 + 1.0
                                 ) * psVar14->direction * (fVar38 - fVar43) + scanline[lVar23];
                            fVar31 = (fVar38 - fVar43) * psVar14->direction;
                          }
                          else {
                            fVar36 = psVar14->fdy;
                            fVar40 = fVar41;
                            iVar16 = iVar13;
                            if (fVar41 < fVar37) {
                              fVar39 = fVar27 - fVar43;
                              fVar43 = (fVar27 - fVar38) + fVar29;
                              fVar36 = -fVar36;
                              fVar40 = fVar37;
                              fVar31 = fVar42;
                              iVar16 = iVar9;
                              iVar9 = iVar13;
                              fVar38 = fVar39 + fVar29;
                              fVar37 = fVar41;
                            }
                            iVar13 = iVar16 + 1;
                            fVar41 = ((float)iVar13 - fVar31) * fVar36 + fVar27;
                            fVar31 = psVar14->direction;
                            fVar42 = (fVar41 - fVar43) * fVar31;
                            lVar23 = (long)iVar16;
                            scanline[lVar23] =
                                 (((fVar37 - (float)iVar16) + 1.0) * -0.5 + 1.0) * fVar42 +
                                 scanline[lVar23];
                            if (iVar9 - iVar13 != 0 && iVar13 <= iVar9) {
                              do {
                                scanline[lVar23 + 1] =
                                     fVar36 * fVar31 * 0.5 + fVar42 + scanline[lVar23 + 1];
                                fVar42 = fVar42 + fVar36 * fVar31;
                                lVar23 = lVar23 + 1;
                              } while (iVar9 + -1 != (int)lVar23);
                            }
                            lVar23 = (long)iVar9;
                            scanline[lVar23] =
                                 (fVar38 - (fVar36 * (float)(iVar9 - iVar13) + fVar41)) *
                                 (((fVar40 - (float)iVar9) + 0.0) * -0.5 + 1.0) * fVar31 + fVar42 +
                                 scanline[lVar23];
                            fVar31 = (fVar38 - fVar43) * fVar31;
                          }
                          local_250[lVar23] = fVar31 + local_250[lVar23];
                          goto LAB_0011089f;
                        }
                      }
                      if (0 < (int)uVar4) {
                        local_268 = ZEXT416((uint)fVar31);
                        local_2a0._8_16_ = ZEXT416((uint)fVar42);
                        local_248 = fVar36;
                        uVar17 = 0;
                        do {
                          fVar38 = (float)(int)uVar17;
                          uVar22 = uVar17 + 1;
                          fVar43 = (float)(int)uVar22;
                          fVar36 = (fVar38 - fVar31) / local_248 + fVar27;
                          fVar37 = (fVar43 - fVar31) / local_248 + fVar27;
                          if ((fVar38 <= fVar31) || (fVar42 <= fVar43)) {
                            if ((fVar42 < fVar38) && (fVar43 < fVar31)) {
                              stbtt__handle_clipped_edge
                                        (scanline,uVar17,psVar14,fVar31,fVar27,fVar43,fVar37);
                              fVar41 = fVar37;
                              fVar31 = fVar43;
LAB_00110610:
                              stbtt__handle_clipped_edge
                                        (scanline,uVar17,psVar14,fVar31,fVar41,fVar38,fVar36);
                              fVar31 = fVar38;
                              goto LAB_0011062a;
                            }
                            fVar41 = fVar27;
                            if (((fVar31 < fVar38) && (fVar38 < fVar42)) ||
                               ((fVar42 < fVar38 && (fVar38 < fVar31)))) goto LAB_00110610;
                            fVar36 = fVar27;
                            if (((fVar31 < fVar43) && (fVar43 < fVar42)) ||
                               ((fVar42 < fVar43 && (fVar43 < fVar31)))) goto LAB_00110576;
                          }
                          else {
                            stbtt__handle_clipped_edge
                                      (scanline,uVar17,psVar14,fVar31,fVar27,fVar38,fVar36);
                            fVar31 = fVar38;
LAB_00110576:
                            stbtt__handle_clipped_edge
                                      (scanline,uVar17,psVar14,fVar31,fVar36,fVar43,fVar37);
                            fVar36 = fVar37;
                            fVar31 = fVar43;
LAB_0011062a:
                            fVar42 = (float)local_2a0._8_4_;
                          }
                          stbtt__handle_clipped_edge
                                    (scanline,uVar17,psVar14,fVar31,fVar36,fVar42,fVar29);
                          fVar31 = (float)local_268._0_4_;
                          fVar42 = (float)local_2a0._8_4_;
                          uVar17 = uVar22;
                        } while (uVar4 != uVar22);
                      }
                    }
                    else if (fVar31 < fVar30) {
                      if (0.0 <= fVar31) {
                        local_268 = ZEXT416((uint)fVar31);
                        stbtt__handle_clipped_edge
                                  (scanline,(int)fVar31,psVar14,fVar31,fVar27,fVar31,fVar29);
                        iVar13 = (int)fVar31 + 1;
                        fVar31 = (float)local_268._0_4_;
                      }
                      else {
                        iVar13 = 0;
                      }
                      stbtt__handle_clipped_edge
                                (local_278,iVar13,psVar14,fVar31,fVar27,fVar31,fVar29);
                    }
LAB_0011089f:
                    psVar14 = psVar14->next;
                  } while (psVar14 != (stbtt__active_edge *)0x0);
                  uVar4 = local_280->w;
                }
                uVar19 = (ulong)uVar4;
                psVar14 = (stbtt__active_edge *)local_2a0._0_8_;
                if (0 < (int)uVar4) {
                  fVar27 = 0.0;
                  lVar23 = 0;
                  do {
                    fVar27 = fVar27 + local_278[lVar23];
                    iVar13 = (int)(ABS(scanline[lVar23] + fVar27) * 255.0 + 0.5);
                    uVar12 = (uchar)iVar13;
                    if (0xfe < iVar13) {
                      uVar12 = 0xff;
                    }
                    local_280->pixels[lVar23 + (long)local_280->stride * (long)local_2e4] = uVar12;
                    lVar23 = lVar23 + 1;
                    uVar19 = (ulong)local_280->w;
                  } while (lVar23 < (long)uVar19);
                }
                for (; psVar14 != (stbtt__active_edge *)0x0; psVar14 = psVar14->next) {
                  psVar14->fx = psVar14->fdx + psVar14->fx;
                }
                uVar21 = (ulong)(local_270 + 1);
                local_2e4 = local_2e4 + 1;
                psVar24 = local_280;
                psVar14 = (stbtt__active_edge *)local_2a0._0_8_;
                puVar25 = local_288;
              } while (local_2e4 < local_280->h);
              while (puVar25 != (undefined8 *)0x0) {
                puVar25 = (undefined8 *)*puVar25;
                (**(code **)((long)userdata + 0x10))(*userdata);
              }
            }
            if (scanline != (float *)&local_238) {
              (**(code **)((long)userdata + 0x10))(*userdata,scanline);
            }
            (**(code **)((long)userdata + 0x10))(*userdata,p_00);
          }
          (**(code **)((long)userdata + 0x10))(*userdata,lVar10);
          (**(code **)((long)userdata + 0x10))(*userdata,points);
        }
      }
    }
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_Rasterize(stbtt__bitmap *result, float flatness_in_pixels, stbtt_vertex *vertices, int num_verts, float scale_x, float scale_y, float shift_x, float shift_y, int x_off, int y_off, int invert, void *userdata)
{
float scale            = scale_x > scale_y ? scale_y : scale_x;
int winding_count      = 0;
int *winding_lengths   = NULL;
stbtt__point *windings = stbtt_FlattenCurves(vertices, num_verts, flatness_in_pixels / scale, &winding_lengths, &winding_count, userdata);
if (windings) {
stbtt__rasterize(result, windings, winding_lengths, winding_count, scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, userdata);
STBTT_free(winding_lengths, userdata);
STBTT_free(windings, userdata);
}
}